

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenTableGrowSetTable(BinaryenExpressionRef expr,char *table)

{
  bool bVar1;
  Name local_30;
  BinaryenExpressionRef local_20;
  Expression *expression;
  char *table_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)table;
  table_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::TableGrow>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<TableGrow>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xa00,"void BinaryenTableGrowSetTable(BinaryenExpressionRef, const char *)");
  }
  if (expression != (Expression *)0x0) {
    wasm::Name::Name(&local_30,(char *)expression);
    wasm::Name::operator=((Name *)(local_20 + 1),&local_30);
    return;
  }
  __assert_fail("table",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xa01,"void BinaryenTableGrowSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenTableGrowSetTable(BinaryenExpressionRef expr, const char* table) {
  auto* expression = (Expression*)expr;
  assert(expression->is<TableGrow>());
  assert(table);
  static_cast<TableGrow*>(expression)->table = table;
}